

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_checkbox_text(nk_context *ctx,char *text,int len,nk_bool *active)

{
  int active_00;
  uint uVar1;
  nk_bool nVar2;
  
  uVar1 = 0;
  if (active != (nk_bool *)0x0 && (text != (char *)0x0 && ctx != (nk_context *)0x0)) {
    active_00 = *active;
    nVar2 = nk_check_text(ctx,text,len,active_00);
    *active = nVar2;
    uVar1 = (uint)(active_00 != nVar2);
  }
  return uVar1;
}

Assistant:

NK_API nk_bool
nk_checkbox_text(struct nk_context *ctx, const char *text, int len, nk_bool *active)
{
int old_val;
NK_ASSERT(ctx);
NK_ASSERT(text);
NK_ASSERT(active);
if (!ctx || !text || !active) return 0;
old_val = *active;
*active = nk_check_text(ctx, text, len, *active);
return old_val != *active;
}